

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

partSizeData *
initTiled(partSizeData *__return_storage_ptr__,
         vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
         *pixelData,vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *buf,
         TiledInputPart *in,Header *outHeader)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pFVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Header *h;
  undefined8 *puVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_node_base *p_Var17;
  Compression *pCVar18;
  runtime_error *this;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  uint64_t uVar25;
  long lVar26;
  int local_12c;
  Box2i dw;
  TileDescription tiling;
  uint uStack_c0;
  Slice local_68 [56];
  
  h = (Header *)Imf_3_4::TiledInputPart::header();
  iVar7 = channelCount(h);
  Imf_3_4::TiledInputPart::header();
  puVar12 = (undefined8 *)Imf_3_4::Header::tileDescription();
  _tiling = *puVar12;
  uVar6 = puVar12[1];
  Imf_3_4::TiledInputPart::header();
  piVar13 = (int *)Imf_3_4::Header::dataWindow();
  iVar1 = *piVar13;
  iVar2 = piVar13[1];
  iVar3 = piVar13[2];
  iVar4 = piVar13[3];
  uStack_c0 = (uint)uVar6;
  if (uStack_c0 < 2) {
    iVar8 = Imf_3_4::TiledInputPart::numLevels();
  }
  else {
    if (uStack_c0 != 2) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"unknown tile mode");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar21 = Imf_3_4::TiledInputPart::numXLevels();
    iVar8 = Imf_3_4::TiledInputPart::numYLevels();
    iVar8 = iVar8 * iVar21;
  }
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::resize(pixelData,(long)iVar8);
  std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::resize(buf,(long)iVar8);
  uVar25 = 0;
  iVar21 = 0;
  iVar8 = 0;
  lVar24 = 0;
  local_12c = 0;
  while( true ) {
    iVar9 = Imf_3_4::TiledInputPart::numXLevels();
    if (iVar9 <= iVar8) break;
    iVar9 = 0;
    while( true ) {
      iVar10 = Imf_3_4::TiledInputPart::numYLevels();
      if (iVar10 <= iVar9) break;
      if (iVar8 == iVar9 || uStack_c0 == 2) {
        Imf_3_4::dataWindowForLevel
                  ((TileDescription *)&dw,(int)&tiling,iVar1,iVar3,iVar2,iVar4,iVar8);
        lVar14 = (long)dw.min.x;
        lVar19 = (long)((dw.max.x - dw.min.x) + 1);
        lVar23 = (long)dw.min.y;
        lVar20 = ((dw.max.y - dw.min.y) + 1) * lVar19;
        lVar15 = (long)local_12c;
        std::
        vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ::resize((pixelData->
                 super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar15,(long)iVar7);
        Imf_3_4::Header::channels();
        p_Var16 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
        lVar26 = 0;
        lVar24 = 0;
        while( true ) {
          Imf_3_4::Header::channels();
          p_Var17 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
          if (p_Var16 == p_Var17) break;
          iVar10 = Imf_3_4::pixelTypeSize(p_Var16[9]._M_color);
          uVar22 = (ulong)iVar10;
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)
                     (*(long *)&(pixelData->
                                super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar15].
                                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar26),lVar20 * uVar22);
          pFVar5 = (buf->
                   super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          Imf_3_4::Slice::Slice
                    (local_68,p_Var16[9]._M_color,
                     (char *)(*(long *)(*(long *)&(pixelData->
                                                  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[lVar15]
                                                  .
                                                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + lVar26) -
                             (lVar23 * lVar19 + lVar14) * uVar22),uVar22,uVar22 * lVar19,1,1,0.0,
                     false,false);
          Imf_3_4::FrameBuffer::insert((char *)(pFVar5 + lVar15),(Slice *)(p_Var16 + 1));
          lVar24 = lVar24 + uVar22;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
          lVar26 = lVar26 + 0x18;
        }
        uVar25 = uVar25 + lVar20;
        local_12c = local_12c + 1;
      }
      iVar10 = Imf_3_4::TiledInputPart::numXTiles((int)in);
      iVar11 = Imf_3_4::TiledInputPart::numYTiles((int)in);
      iVar21 = iVar21 + iVar11 * iVar10;
      iVar9 = iVar9 + 1;
    }
    iVar8 = iVar8 + 1;
  }
  partSizeData::partSizeData(__return_storage_ptr__);
  __return_storage_ptr__->rawSize = lVar24 * uVar25;
  __return_storage_ptr__->pixelCount = uVar25;
  __return_storage_ptr__->tileCount = (long)iVar21;
  __return_storage_ptr__->isTiled = true;
  Imf_3_4::TiledInputPart::header();
  Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->partType);
  Imf_3_4::TiledInputPart::header();
  pCVar18 = (Compression *)Imf_3_4::Header::compression();
  __return_storage_ptr__->compression = *pCVar18;
  __return_storage_ptr__->channelCount = (long)iVar7;
  return __return_storage_ptr__;
}

Assistant:

partSizeData
initTiled (
    vector<vector<vector<char>>>& pixelData,
    vector<FrameBuffer>&          buf,
    TiledInputPart&               in,
    const Header&                 outHeader)
{
    int             numChans = channelCount (in.header ());
    TileDescription tiling   = in.header ().tileDescription ();

    Box2i imageDw = in.header ().dataWindow ();
    int   totalLevels;
    switch (tiling.mode)
    {
        case ONE_LEVEL: totalLevels = 1; //break;
        case MIPMAP_LEVELS: totalLevels = in.numLevels (); break;
        case RIPMAP_LEVELS:
            totalLevels = in.numXLevels () * in.numYLevels ();
            break;
        case NUM_LEVELMODES:
        default: throw runtime_error ("unknown tile mode");
    }
    pixelData.resize (totalLevels);
    buf.resize (totalLevels);

    int     levelIndex  = 0;
    int64_t pixelSize   = 0;
    size_t  totalPixels = 0;
    int     tileCount   = 0;

    //
    // allocate memory and initialize frameBuffer for each level
    //
    for (int xLevel = 0; xLevel < in.numXLevels (); ++xLevel)
    {
        for (int yLevel = 0; yLevel < in.numYLevels (); ++yLevel)
        {
            if (tiling.mode == RIPMAP_LEVELS || xLevel == yLevel)
            {
                Box2i dw = dataWindowForLevel (
                    tiling,
                    imageDw.min.x,
                    imageDw.max.x,
                    imageDw.min.y,
                    imageDw.max.y,
                    xLevel,
                    yLevel);
                uint64_t width     = dw.max.x + 1 - dw.min.x;
                uint64_t height    = dw.max.y + 1 - dw.min.y;
                uint64_t numPixels = width * height;
                uint64_t offsetToOrigin =
                    width * static_cast<uint64_t> (dw.min.y) +
                    static_cast<uint64_t> (dw.min.x);
                int channelNumber = 0;

                pixelData[levelIndex].resize (numChans);
                pixelSize = 0;
                for (ChannelList::ConstIterator i =
                         outHeader.channels ().begin ();
                     i != outHeader.channels ().end ();
                     ++i)
                {
                    int samplesize = pixelTypeSize (i.channel ().type);
                    pixelData[levelIndex][channelNumber].resize (
                        numPixels * samplesize);

                    buf[levelIndex].insert (
                        i.name (),
                        Slice (
                            i.channel ().type,
                            pixelData[levelIndex][channelNumber].data () -
                                offsetToOrigin * samplesize,
                            samplesize,
                            samplesize * width));
                    ++channelNumber;
                    pixelSize += samplesize;
                }
                totalPixels += numPixels;
                ++levelIndex;
            }
            tileCount += in.numXTiles (xLevel) * in.numYTiles (yLevel);
        }
    }
    partSizeData data;
    data.rawSize      = pixelSize * totalPixels;
    data.pixelCount   = totalPixels;
    data.tileCount    = tileCount;
    data.isTiled      = true;
    data.partType     = in.header ().type ();
    data.compression  = in.header ().compression ();
    data.channelCount = numChans;
    return data;
}